

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O3

Vec4 __thiscall glcts::BlendSoftLight(glcts *this,Vec4 *src,Vec4 *dst)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Vec4 VVar6;
  Vec4 rgb;
  Vec4 local_28;
  
  fVar4 = src->m_data[0];
  fVar5 = dst->m_data[0];
  if (fVar4 <= 0.5) {
    fVar5 = fVar5 - (1.0 - (fVar4 + fVar4)) * fVar5 * (1.0 - fVar5);
  }
  else {
    fVar4 = fVar4 + fVar4 + -1.0;
    if (fVar5 <= 0.25) {
      fVar5 = ((fVar5 * 16.0 + -12.0) * fVar5 + 3.0) * fVar4 * fVar5 + fVar5;
    }
    else {
      if (fVar5 < 0.0) {
        fVar1 = sqrtf(fVar5);
      }
      else {
        fVar1 = SQRT(fVar5);
      }
      fVar5 = fVar4 * (fVar1 - fVar5) + fVar5;
    }
  }
  fVar4 = src->m_data[1];
  fVar1 = dst->m_data[1];
  if (fVar4 <= 0.5) {
    fVar1 = fVar1 - (1.0 - (fVar4 + fVar4)) * fVar1 * (1.0 - fVar1);
  }
  else {
    fVar4 = fVar4 + fVar4 + -1.0;
    if (fVar1 <= 0.25) {
      fVar1 = ((fVar1 * 16.0 + -12.0) * fVar1 + 3.0) * fVar4 * fVar1 + fVar1;
    }
    else {
      if (fVar1 < 0.0) {
        fVar2 = sqrtf(fVar1);
      }
      else {
        fVar2 = SQRT(fVar1);
      }
      fVar1 = fVar4 * (fVar2 - fVar1) + fVar1;
    }
  }
  fVar4 = src->m_data[2];
  fVar2 = dst->m_data[2];
  if (fVar4 <= 0.5) {
    local_28.m_data[2] = fVar2 - (1.0 - (fVar4 + fVar4)) * fVar2 * (1.0 - fVar2);
  }
  else {
    fVar4 = fVar4 + fVar4 + -1.0;
    if (fVar2 <= 0.25) {
      local_28.m_data[2] = ((fVar2 * 16.0 + -12.0) * fVar2 + 3.0) * fVar4 * fVar2 + fVar2;
    }
    else {
      if (fVar2 < 0.0) {
        fVar3 = sqrtf(fVar2);
      }
      else {
        fVar3 = SQRT(fVar2);
      }
      local_28.m_data[2] = fVar4 * (fVar3 - fVar2) + fVar2;
    }
  }
  local_28.m_data[3] = 0.0;
  local_28.m_data[0] = fVar5;
  local_28.m_data[1] = fVar1;
  VVar6 = Blend(&local_28,src,dst);
  return (Vec4)VVar6.m_data;
}

Assistant:

static tcu::Vec4 BlendSoftLight(const tcu::Vec4& src, const tcu::Vec4& dst)
{
	tcu::Vec4 rgb(SoftLight(src[0], dst[0]), SoftLight(src[1], dst[1]), SoftLight(src[2], dst[2]), 0.f);

	return Blend(rgb, src, dst);
}